

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_file_iwrite_at_all_
               (MPIABI_Fint *fh,MPIABI_Fint *offset,void *buf,MPIABI_Fint *count,
               MPIABI_Fint *datatype,MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  mpi_file_iwrite_at_all_();
  return;
}

Assistant:

void mpiabi_file_iwrite_at_all_(
  const MPIABI_Fint * fh,
  const MPIABI_Fint * offset,
  const void * buf,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_file_iwrite_at_all_(
    fh,
    offset,
    buf,
    count,
    datatype,
    request,
    ierror
  );
}